

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2ktx2.cpp
# Opt level: O1

void __thiscall ktxUpgrader::usage(ktxUpgrader *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->super_ktxApp).name._M_dataplus._M_p,
                      (this->super_ktxApp).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             " [options] [<infile> ...]\n\n  infile       The source ktx file. The output is written to a file of the\n               same name with the extension changed to \'.ktx2\'. If it is not\n               specified input will be read from stdin and the converted texture\n               written to stdout.\n\n  Options are:\n\n  -b, --rewritebado\n               Rewrite bad orientation metadata. Some in-the-wild KTX files\n               have orientation metadata with the key \"KTXOrientation\"\n               instead of \"KTXorientaion\". This option will rewrite such\n               bad metadata instead of dropping it.\n  -o outfile, --output=outfile\n               Name the output file outfile. If @e outfile is \'stdout\', output\n               will be written to stdout. If there is more than 1 infile,\n               the command prints its usage message and exits.\n  -f, --force  If the output file already exists, remove it and create a\n               new file, without prompting for confirmation regardless of\n               its permissions.\n"
             ,0x405);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "  -h, --help    Print this usage message and exit.\n  -v, --version Print the version number of this program and exit.\n"
             ,0x76);
  return;
}

Assistant:

void
ktxUpgrader::usage()
{
    cerr <<
        "Usage: " << name << " [options] [<infile> ...]\n"
        "\n"
        "  infile       The source ktx file. The output is written to a file of the\n"
        "               same name with the extension changed to '.ktx2'. If it is not\n"
        "               specified input will be read from stdin and the converted texture\n"
        "               written to stdout.\n"
        "\n"
        "  Options are:\n"
        "\n"
        "  -b, --rewritebado\n"
        "               Rewrite bad orientation metadata. Some in-the-wild KTX files\n"
        "               have orientation metadata with the key \"KTXOrientation\"\n"
        "               instead of \"KTXorientaion\". This option will rewrite such\n"
        "               bad metadata instead of dropping it.\n"
        "  -o outfile, --output=outfile\n"
        "               Name the output file outfile. If @e outfile is 'stdout', output\n"
        "               will be written to stdout. If there is more than 1 infile,\n"
        "               the command prints its usage message and exits.\n"
        "  -f, --force  If the output file already exists, remove it and create a\n"
        "               new file, without prompting for confirmation regardless of\n"
        "               its permissions.\n";
        ktxApp::usage();
}